

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O2

void __thiscall Logic::Run(Logic *this,QLearning *q,int *r)

{
  vector<int,_std::allocator<int>_> *__k;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  char cVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  time_t tVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  int iVar12;
  int i;
  size_type __n;
  float fVar13;
  allocator local_169;
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_168;
  _InputArray local_160;
  vector<float,_std::allocator<float>_> max_future;
  vector<int,_std::allocator<int>_> player_pos;
  double local_f0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  Player p;
  undefined8 local_b0;
  Mat Picture;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __k = &this->_observations;
  local_168 = &q->_q_table;
  iVar7 = 0;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x406fe000;
  do {
    if (iVar7 == 5000) {
      return;
    }
    Player::Player(&p,*r);
    player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f0 = 0.0;
    for (iVar12 = 0; iVar12 != 200; iVar12 = iVar12 + 1) {
      _Picture = CONCAT44(p.y,p.x);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&player_pos,&Picture,&uStack_a0);
      for (__n = 0; __n != 2; __n = __n + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(&player_pos,__n);
        iVar6 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,__n);
        (__k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[__n] = iVar6 - *pvVar8;
      }
      tVar9 = time((time_t *)0x0);
      srand((uint)tVar9);
      iVar6 = rand();
      fVar13 = QLearning::GetEpsilon(q);
      if ((float)iVar6 / 2.1474836e+09 <= fVar13) {
        iVar6 = rand();
        iVar6 = iVar6 % q->_actionSize;
        this->_action = iVar6;
      }
      else {
        pmVar10 = std::
                  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](local_168,__k);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&Picture,pmVar10);
        iVar6 = arg_max<float,std::allocator<float>>
                          (this,(vector<float,_std::allocator<float>_> *)&Picture);
        this->_action = iVar6;
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&Picture);
        iVar6 = this->_action;
      }
      Player::action((vector<int,_std::allocator<int>_> *)&Picture,&p,iVar6);
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&player_pos);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&Picture);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&player_pos,0);
      iVar6 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
      iVar1 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&player_pos,1);
      iVar2 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
      iVar3 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&player_pos,0);
      iVar4 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
      if (iVar4 == *pvVar8) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(&player_pos,1);
        iVar4 = *pvVar8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
        if (iVar4 == *pvVar8) {
          poVar11 = std::operator<<((ostream *)&std::cout,"Goal reached");
          std::endl<char,std::char_traits<char>>(poVar11);
          break;
        }
      }
      local_98 = 0;
      _Picture = 0;
      uStack_a0 = 0;
      std::
      transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,std::minus<int>>
                (player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 player_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,&Picture);
      this_00 = local_168;
      max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pmVar10 = std::
                map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[](local_168,(key_type *)&Picture);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)
                 &max_future.super__Vector_base<float,_std::allocator<float>_>,pmVar10);
      std::
      __max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[](this_00,__k);
      std::
      map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[](this_00,__k);
      local_f0 = local_f0 + 1.0 / ((double)((iVar6 + iVar2) - (iVar1 + iVar3)) + 0.001);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&max_future.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&Picture);
    }
    fVar13 = QLearning::GetEpsilon(q);
    poVar11 = std::operator<<((ostream *)&std::cout,"#----------------------");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
    std::operator<<(poVar11," Episode Reward: ");
    poVar11 = std::ostream::_M_insert<double>(local_f0);
    std::endl<char,std::char_traits<char>>(poVar11);
    QLearning::SetEpsilon(q,fVar13 * QLearning::_EPS_DECAY);
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&max_future);
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cv::Mat::Mat(&Picture,0x140,0xf0,0x10,(Scalar_ *)&max_future);
    cVar5 = cv::Mat::empty();
    if (cVar5 != '\0') {
      poVar11 = std::operator<<((ostream *)&std::cout,"Could not instantiate the image");
      std::endl<char,std::char_traits<char>>(poVar11);
      std::istream::get();
    }
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(max_future.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
    local_160.sz.width = 0;
    local_160.sz.height = 0;
    local_160.flags = 0x2010000;
    local_b0 = 0x1f4000001f4;
    local_160.obj = &Picture;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&Picture;
    cv::resize(0,0,(Scalar_ *)&max_future,&local_160,&local_b0,1);
    local_160.sz.width = 0;
    local_160.sz.height = 0;
    local_160.flags = 0x3010000;
    local_160.obj = &Picture;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,0);
    iVar12 = *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(&Player::_goal,1);
    local_d0 = iVar12 * 0x14;
    local_cc = *pvVar8 * 0x14;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&max_future);
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(uStack_44,local_48);
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(uStack_3c,uStack_40);
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::circle(&local_160,&local_d0,0x14,(string *)&max_future,2,8,0);
    local_d8 = p.x * 0x14;
    local_d4 = p.y * 0x14;
    local_160.sz.width = 0;
    local_160.sz.height = 0;
    local_160.flags = 0x3010000;
    local_160.obj = &Picture;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&max_future);
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x406fe00000000000;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    max_future.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x406fe00000000000;
    cv::circle(&local_160,&local_d8,0x14,(string *)&max_future,0xfffffffffffffffe,8,0);
    std::__cxx11::string::string
              ((string *)&max_future,"Path planner Reinforcement-Learning",&local_169);
    local_160.sz.width = 0;
    local_160.sz.height = 0;
    local_160.flags = 0x1010000;
    local_160.obj = &Picture;
    cv::imshow((string *)&max_future,&local_160);
    std::__cxx11::string::~string((string *)&max_future);
    cv::waitKey(10);
    std::__cxx11::string::string
              ((string *)&max_future,"Path planner Reinforcement-Learning",(allocator *)&local_160);
    cv::destroyWindow((string *)&max_future);
    std::__cxx11::string::~string((string *)&max_future);
    cv::Mat::~Mat(&Picture);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&player_pos.super__Vector_base<int,_std::allocator<int>_>);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Logic::Run(QLearning &q, const int &r)
{

    //int k = erl::QLearning::_EPISODES;

    for (int i = 0; i < 5000; i++)
    {
        Player p(r);
        double episode_reward = 0;
        std::vector<int> player_pos;

        for (int j = 0; j < 200; j++)
        {
            player_pos = {p.x, p.y};
            //std::cout << "Previous position " << p.x << " " << p.y << std::endl;
            // std::transform(player_pos.begin(),player_pos.end(),(p.GetGoal()).begin(), std::back_inserter(_observations),std::minus<int>()); //to be completed
            for (int i = 0; i < 2; i++)
            {
                _observations[i] = player_pos.at(i) - Player::_goal.at(i);
            }
            //std::cout<<"Observation<<"<<_observations[0]<< " "<<_observations[1]<<" " <<_observations[2]<<std::endl;
            //
            srand((unsigned)time(NULL));
            //std::cout<<q.GetEpsilon()<<std::endl;

            if (((double)rand() / (RAND_MAX)) > q.GetEpsilon())
            {
                //std::cout<<((double) rand() / (RAND_MAX)) <<std::endl;
                std::vector<float> vec = q._q_table[_observations];
                _action = arg_max(vec);
                //std::cout<<"action selected is "<<_action<<std::endl;
            }
            else
            {
                _action = (int)rand() % (q._actionSize) + 0;
                //std::cout<<"action selected is "<<_action<<std::endl;
                //std::cout<<"exit "<<((double) rand() / (RAND_MAX))<<std::endl;
            }
            player_pos = p.action(_action);
            //Play around with the reward function                                                //Player takes action in this stage
            double reward = 1 / ((player_pos.at(0) -  Player::_goal.at(0)) + (player_pos.at(1) -  Player::_goal.at(1)) + 0.001); //Assuming we had a vector with 2 states
            //std::cout<<reward<<std::endl;

            //std::cout << "New position " << player_pos.at(0) << " " << player_pos.at(1) << std::endl;

            if (player_pos.at(0) ==  Player::_goal.at(0) && player_pos.at(1) ==  Player::_goal.at(1))
            {
                std::cout << "Goal reached" << std::endl;
                break;
            }

            std::vector<int> new_obs;
            std::transform(player_pos.begin(), player_pos.end(), (Player::_goal).begin(), std::back_inserter(new_obs), std::minus<int>());
            //std::cout << "New Observation<<" << new_obs[0] << " " << new_obs[1] << " " << std::endl;

            std::vector<float> max_future;
            try
            {
                max_future = q._q_table[new_obs];
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            std::vector<float>::iterator max_future_q;
            try
            {                                                                             //get all qvalues corresponding next best state
                max_future_q = max_element(std::begin(max_future), std::end(max_future)); // c++11
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout << "Observation<<" << _observations[0] << " " << _observations[1] << std::endl;
            //std::cout << "Action<<" << _action << std::endl;
            //std::cout<<q._q_table[_observations][_action]<<std::endl;
            float current_q;
            try
            {
                float current_q = q._q_table[_observations][_action];
            } //get the best qvalue corresponding next best state
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout<<current_q<<std::endl;
            float new_q;
            try
            {
                float new_q = (1 - QLearning::_LEARNING_RATE) * current_q + QLearning::_LEARNING_RATE * (reward + QLearning::_DISCOUNT * (*max_future_q));
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }

            try
            {
                q._q_table[_observations][_action] = new_q;
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            episode_reward += reward;

            //
            //
            //
            //
        }

        float ep = q.GetEpsilon();
        std::cout << "#----------------------" << i << " Episode Reward: " << episode_reward << std::endl;
        q.SetEpsilon(ep * (QLearning::_EPS_DECAY)); //Epsilon Decay;
        //     // Read the image file

        Mat Picture(320, 240, CV_8UC3, cv::Scalar(0, 0, 0));
        // Check for failure
        if (Picture.empty())
        {
            std::cout << "Could not instantiate the image" << std::endl;
            std::cin.get(); //wait for any key press
        }

        resize(Picture, Picture, Size(500, 500));

        //A Parameters x (start in x axes horizontal) y (start in vertical)

        // w (vertical lenght)  h (Horizontal lenght)

        //Rect RectangleToDraw(2, 2, 100, 100);
        //Scaling by 20
        circle(Picture, Point(Player::_goal.at(0)*20, Player::_goal.at(1)*20), 20, Scalar(0, 255, 0), 2, 8, 0);

        Point p1 = Point(20 * p.x, 20 * p.y);
        circle(Picture, p1, 20, Scalar(255, 0, 255), -2, 8, 0);

        imshow("Path planner Reinforcement-Learning", Picture);
        waitKey(10);
        destroyWindow("Path planner Reinforcement-Learning");
    }
}